

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::TagInfo::all_abi_cxx11_(string *__return_storage_ptr__,TagInfo *this)

{
  bool bVar1;
  size_type sVar2;
  reference pSVar3;
  size_type sVar4;
  StringRef rhs;
  StringRef *spelling_1;
  iterator __end1_1;
  iterator __begin1_1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range1_1;
  StringRef *spelling;
  iterator __end1;
  iterator __begin1;
  set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_> *__range1;
  size_t size;
  TagInfo *this_local;
  string *out;
  
  sVar2 = std::set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
          ::size(&this->spellings);
  sVar4 = sVar2 << 1;
  __end1 = std::
           set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
           begin(&this->spellings);
  spelling = (StringRef *)
             std::
             set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
             end(&this->spellings);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&spelling), bVar1) {
    pSVar3 = std::_Rb_tree_const_iterator<Catch::StringRef>::operator*(&__end1);
    StringRef::size(pSVar3);
    std::_Rb_tree_const_iterator<Catch::StringRef>::operator++(&__end1);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end1_1 = std::
             set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>::
             begin(&this->spellings);
  spelling_1 = (StringRef *)
               std::
               set<Catch::StringRef,_std::less<Catch::StringRef>,_std::allocator<Catch::StringRef>_>
               ::end(&this->spellings);
  while (bVar1 = std::operator!=(&__end1_1,(_Self *)&spelling_1), bVar1) {
    pSVar3 = std::_Rb_tree_const_iterator<Catch::StringRef>::operator*(&__end1_1);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'[');
    rhs.m_size = sVar4;
    rhs.m_start = (char *)pSVar3->m_size;
    Catch::operator+=((Catch *)__return_storage_ptr__,(string *)pSVar3->m_start,rhs);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,']');
    std::_Rb_tree_const_iterator<Catch::StringRef>::operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TagInfo::all() const {
        // 2 per tag for brackets '[' and ']'
        size_t size =  spellings.size() * 2;
        for (auto const& spelling : spellings) {
            size += spelling.size();
        }

        std::string out; out.reserve(size);
        for (auto const& spelling : spellings) {
            out += '[';
            out += spelling;
            out += ']';
        }
        return out;
    }